

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaK_code(FuncState *fs,Instruction i,int line)

{
  long lVar1;
  void *pvVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  Proto *f;
  size_t in_stack_00000018;
  int *in_stack_00000020;
  void *in_stack_00000028;
  lua_State *in_stack_00000030;
  
  lVar1 = *in_RDI;
  dischargejpc((FuncState *)0x116687);
  if (*(int *)(lVar1 + 0x50) < (int)in_RDI[6] + 1) {
    pvVar2 = luaM_growaux_(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                           fs._4_4_,(char *)CONCAT44(i,line));
    *(void **)(lVar1 + 0x18) = pvVar2;
  }
  *(undefined4 *)(*(long *)(lVar1 + 0x18) + (long)(int)in_RDI[6] * 4) = in_ESI;
  if (*(int *)(lVar1 + 0x54) < (int)in_RDI[6] + 1) {
    pvVar2 = luaM_growaux_(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                           fs._4_4_,(char *)CONCAT44(i,line));
    *(void **)(lVar1 + 0x28) = pvVar2;
  }
  *(undefined4 *)(*(long *)(lVar1 + 0x28) + (long)(int)in_RDI[6] * 4) = in_EDX;
  lVar1 = in_RDI[6];
  *(int *)(in_RDI + 6) = (int)lVar1 + 1;
  return (int)lVar1;
}

Assistant:

static int luaK_code(FuncState*fs,Instruction i,int line){
Proto*f=fs->f;
dischargejpc(fs);
luaM_growvector(fs->L,f->code,fs->pc,f->sizecode,Instruction,
(INT_MAX-2),"code size overflow");
f->code[fs->pc]=i;
luaM_growvector(fs->L,f->lineinfo,fs->pc,f->sizelineinfo,int,
(INT_MAX-2),"code size overflow");
f->lineinfo[fs->pc]=line;
return fs->pc++;
}